

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

int instantiate_cfg_file(pmtr_t *cfg)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_b0 [8];
  stat s;
  int cs;
  int sr;
  int rc;
  pmtr_t *cfg_local;
  
  cs = -1;
  iVar2 = stat(cfg->file,(stat *)local_b0);
  if (iVar2 == 0) {
    cs = 0;
  }
  else {
    syslog(6,"creating empty %s",cfg->file);
    s.__glibc_reserved[2]._4_4_ = open(cfg->file,0xc1,0x180);
    if (s.__glibc_reserved[2]._4_4_ < 0) {
      pcVar1 = cfg->file;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"can\'t create %s: %s",pcVar1,pcVar4);
    }
    else {
      close(s.__glibc_reserved[2]._4_4_);
      cs = 0;
    }
  }
  return cs;
}

Assistant:

int instantiate_cfg_file(pmtr_t *cfg) {
  int rc = -1, sr, cs;
  struct stat s;

  /* does it exist? */
  sr = stat(cfg->file, &s);
  if (sr == 0) { rc = 0; goto done; } /* yes, done */

  /* try to create it */
  syslog(LOG_INFO,"creating empty %s", cfg->file);
  cs = open(cfg->file, O_WRONLY|O_CREAT|O_EXCL, 0600);
  if (cs < 0) {
    syslog(LOG_ERR,"can't create %s: %s", cfg->file, strerror(errno));
    goto done;
  } else {
    close(cs);
  }

  rc = 0;

 done:
  return rc;
}